

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tri.c
# Opt level: O0

int main(int argc,char **argv)

{
  GLFWwindow *handle;
  char **argv_local;
  int argc_local;
  
  glfwInit();
  glfwWindowHint(0x20004,0);
  glfwWindowHint(0x2200b,0x36002);
  glfwWindowHint(0x22001,0x30001);
  handle = glfwCreateWindow(300,300,*argv,(GLFWmonitor *)0x0,(GLFWwindow *)0x0);
  window = handle;
  if (handle == (GLFWwindow *)0x0) {
    argv_local._4_4_ = 0x7d;
  }
  else {
    glfwMakeContextCurrent(handle);
    init((EVP_PKEY_CTX *)handle);
    reshape();
    draw();
    glfwDestroyWindow(window);
    glfwTerminate();
    argv_local._4_4_ = 0;
  }
  return argv_local._4_4_;
}

Assistant:

int
main(int argc, char *argv[])
{
   glfwInit();

   glfwWindowHint(GLFW_VISIBLE, GL_FALSE);
   glfwWindowHint(GLFW_CONTEXT_CREATION_API, GLFW_EGL_CONTEXT_API);
   glfwWindowHint(GLFW_CLIENT_API, GLFW_OPENGL_API);

   window = glfwCreateWindow(300, 300, argv[0], NULL, NULL);
   if (!window) {
       return EXIT_SKIP;
   }

   glfwMakeContextCurrent(window);

   init();
   reshape();
   draw();

   glfwDestroyWindow(window);
   glfwTerminate();

   return 0;
}